

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>_>
::rehash(sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>_>
         *this,size_t num_buckets)

{
  ulong uVar1;
  char max_lookups;
  EntryPointer begin;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  EntryPointer psVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int8_t iVar33;
  size_t sVar34;
  ulong uVar35;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
  *psVar36;
  ulong uVar37;
  EntryPointer it;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
  *psVar38;
  byte bVar39;
  anon_union_32_1_a8c68091_for_sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_3
  *key;
  long lVar40;
  undefined4 uVar41;
  double dVar42;
  undefined4 uVar44;
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar65;
  int iVar68;
  int iVar69;
  undefined1 auVar66 [16];
  int iVar70;
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar84;
  int iVar88;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  ulong local_38;
  
  auVar45._0_8_ = (double)CONCAT44(0x43300000,(int)this->num_elements);
  auVar45._8_4_ = (int)(this->num_elements >> 0x20);
  auVar45._12_4_ = 0x45300000;
  auVar46._0_8_ = (double)this->_max_load_factor;
  auVar46._8_8_ = 0;
  dVar42 = ceil(((auVar45._8_8_ - 1.9342813113834067e+25) + (auVar45._0_8_ - 4503599627370496.0)) /
                auVar46._0_8_);
  local_38 = (long)(dVar42 - 9.223372036854776e+18) & (long)dVar42 >> 0x3f | (long)dVar42;
  if (local_38 <= num_buckets) {
    local_38 = num_buckets;
  }
  if (local_38 == 0) {
    reset_to_empty_state(this);
    return;
  }
  iVar33 = fibonacci_hash_policy::next_size_over(&this->hash_policy,&local_38);
  sVar34 = this->num_slots_minus_one;
  if (sVar34 != 0) {
    sVar34 = sVar34 + 1;
  }
  if (local_38 != sVar34) {
    uVar35 = local_38 >> 1 | local_38;
    uVar35 = uVar35 >> 2 | uVar35;
    uVar35 = uVar35 >> 4 | uVar35;
    uVar35 = uVar35 >> 8 | uVar35;
    uVar35 = uVar35 >> 0x10 | uVar35;
    uVar35 = uVar35 >> 0x20 | uVar35;
    bVar39 = 4;
    if ('\x04' < (char)log2(unsigned_long)::table
                       [(uVar35 - (uVar35 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a]) {
      bVar39 = log2(unsigned_long)::table[(uVar35 - (uVar35 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a];
    }
    uVar35 = (ulong)bVar39;
    psVar36 = __gnu_cxx::
              new_allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
              ::allocate((new_allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
                          *)this,local_38 + uVar35,(void *)0x0);
    auVar32 = _DAT_003e7450;
    auVar31 = _DAT_003e7440;
    auVar30 = _DAT_003e7430;
    auVar29 = _DAT_003e7420;
    auVar28 = _DAT_003e7410;
    auVar27 = _DAT_003e7400;
    auVar45 = _DAT_003e64d0;
    if (psVar36 != psVar36 + local_38 + (uVar35 - 1)) {
      uVar1 = (uVar35 + local_38) * 0x28 - 0x50;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar1;
      uVar41 = SUB164(auVar66 * ZEXT816(0xcccccccccccccccd),8);
      uVar44 = (undefined4)(uVar1 / 0x140000000);
      auVar71._0_8_ = CONCAT44(uVar44,uVar41);
      auVar71._8_4_ = uVar41;
      auVar71._12_4_ = uVar44;
      auVar43._0_8_ = auVar71._0_8_ >> 5;
      auVar43._8_8_ = auVar71._8_8_ >> 5;
      uVar37 = 0;
      psVar38 = psVar36;
      do {
        auVar63._8_4_ = (int)uVar37;
        auVar63._0_8_ = uVar37;
        auVar63._12_4_ = (int)(uVar37 >> 0x20);
        auVar66 = auVar43 ^ auVar45;
        auVar71 = (auVar63 | auVar32) ^ auVar45;
        iVar65 = auVar66._0_4_;
        iVar84 = -(uint)(iVar65 < auVar71._0_4_);
        iVar68 = auVar66._4_4_;
        auVar73._4_4_ = -(uint)(iVar68 < auVar71._4_4_);
        iVar69 = auVar66._8_4_;
        iVar88 = -(uint)(iVar69 < auVar71._8_4_);
        iVar70 = auVar66._12_4_;
        auVar73._12_4_ = -(uint)(iVar70 < auVar71._12_4_);
        auVar12._4_4_ = iVar84;
        auVar12._0_4_ = iVar84;
        auVar12._8_4_ = iVar88;
        auVar12._12_4_ = iVar88;
        auVar46 = pshuflw(auVar46,auVar12,0xe8);
        auVar72._4_4_ = -(uint)(auVar71._4_4_ == iVar68);
        auVar72._12_4_ = -(uint)(auVar71._12_4_ == iVar70);
        auVar72._0_4_ = auVar72._4_4_;
        auVar72._8_4_ = auVar72._12_4_;
        auVar71 = pshuflw(in_XMM2,auVar72,0xe8);
        auVar73._0_4_ = auVar73._4_4_;
        auVar73._8_4_ = auVar73._12_4_;
        auVar66 = pshuflw(auVar46,auVar73,0xe8);
        auVar47._8_4_ = 0xffffffff;
        auVar47._0_8_ = 0xffffffffffffffff;
        auVar47._12_4_ = 0xffffffff;
        auVar47 = (auVar66 | auVar71 & auVar46) ^ auVar47;
        auVar46 = packssdw(auVar47,auVar47);
        if ((auVar46 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar38->distance_from_desired = -1;
        }
        auVar13._4_4_ = iVar84;
        auVar13._0_4_ = iVar84;
        auVar13._8_4_ = iVar88;
        auVar13._12_4_ = iVar88;
        auVar73 = auVar72 & auVar13 | auVar73;
        auVar46 = packssdw(auVar73,auVar73);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar46 = packssdw(auVar46 ^ auVar2,auVar46 ^ auVar2);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46._0_4_ >> 8 & 1) != 0) {
          psVar38[1].distance_from_desired = -1;
        }
        auVar46 = (auVar63 | auVar31) ^ auVar45;
        auVar56._0_4_ = -(uint)(iVar65 < auVar46._0_4_);
        auVar56._4_4_ = -(uint)(iVar68 < auVar46._4_4_);
        auVar56._8_4_ = -(uint)(iVar69 < auVar46._8_4_);
        auVar56._12_4_ = -(uint)(iVar70 < auVar46._12_4_);
        auVar74._4_4_ = auVar56._0_4_;
        auVar74._0_4_ = auVar56._0_4_;
        auVar74._8_4_ = auVar56._8_4_;
        auVar74._12_4_ = auVar56._8_4_;
        iVar84 = -(uint)(auVar46._4_4_ == iVar68);
        iVar88 = -(uint)(auVar46._12_4_ == iVar70);
        auVar14._4_4_ = iVar84;
        auVar14._0_4_ = iVar84;
        auVar14._8_4_ = iVar88;
        auVar14._12_4_ = iVar88;
        auVar85._4_4_ = auVar56._4_4_;
        auVar85._0_4_ = auVar56._4_4_;
        auVar85._8_4_ = auVar56._12_4_;
        auVar85._12_4_ = auVar56._12_4_;
        auVar46 = auVar14 & auVar74 | auVar85;
        auVar46 = packssdw(auVar46,auVar46);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar46 = packssdw(auVar46 ^ auVar3,auVar46 ^ auVar3);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46._0_4_ >> 0x10 & 1) != 0) {
          psVar38[2].distance_from_desired = -1;
        }
        auVar46 = pshufhw(auVar46,auVar74,0x84);
        auVar15._4_4_ = iVar84;
        auVar15._0_4_ = iVar84;
        auVar15._8_4_ = iVar88;
        auVar15._12_4_ = iVar88;
        auVar71 = pshufhw(auVar56,auVar15,0x84);
        auVar66 = pshufhw(auVar46,auVar85,0x84);
        auVar48._8_4_ = 0xffffffff;
        auVar48._0_8_ = 0xffffffffffffffff;
        auVar48._12_4_ = 0xffffffff;
        auVar48 = (auVar66 | auVar71 & auVar46) ^ auVar48;
        auVar46 = packssdw(auVar48,auVar48);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46._0_4_ >> 0x18 & 1) != 0) {
          psVar38[3].distance_from_desired = -1;
        }
        auVar46 = (auVar63 | auVar30) ^ auVar45;
        auVar57._0_4_ = -(uint)(iVar65 < auVar46._0_4_);
        auVar57._4_4_ = -(uint)(iVar68 < auVar46._4_4_);
        auVar57._8_4_ = -(uint)(iVar69 < auVar46._8_4_);
        auVar57._12_4_ = -(uint)(iVar70 < auVar46._12_4_);
        auVar16._4_4_ = auVar57._0_4_;
        auVar16._0_4_ = auVar57._0_4_;
        auVar16._8_4_ = auVar57._8_4_;
        auVar16._12_4_ = auVar57._8_4_;
        auVar71 = pshuflw(auVar85,auVar16,0xe8);
        auVar49._0_4_ = -(uint)(auVar46._0_4_ == iVar65);
        auVar49._4_4_ = -(uint)(auVar46._4_4_ == iVar68);
        auVar49._8_4_ = -(uint)(auVar46._8_4_ == iVar69);
        auVar49._12_4_ = -(uint)(auVar46._12_4_ == iVar70);
        auVar75._4_4_ = auVar49._4_4_;
        auVar75._0_4_ = auVar49._4_4_;
        auVar75._8_4_ = auVar49._12_4_;
        auVar75._12_4_ = auVar49._12_4_;
        auVar46 = pshuflw(auVar49,auVar75,0xe8);
        auVar76._4_4_ = auVar57._4_4_;
        auVar76._0_4_ = auVar57._4_4_;
        auVar76._8_4_ = auVar57._12_4_;
        auVar76._12_4_ = auVar57._12_4_;
        auVar66 = pshuflw(auVar57,auVar76,0xe8);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar46 = packssdw(auVar46 & auVar71,(auVar66 | auVar46 & auVar71) ^ auVar4);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar38[4].distance_from_desired = -1;
        }
        auVar17._4_4_ = auVar57._0_4_;
        auVar17._0_4_ = auVar57._0_4_;
        auVar17._8_4_ = auVar57._8_4_;
        auVar17._12_4_ = auVar57._8_4_;
        auVar76 = auVar75 & auVar17 | auVar76;
        auVar66 = packssdw(auVar76,auVar76);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar46 = packssdw(auVar46,auVar66 ^ auVar5);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46._4_2_ >> 8 & 1) != 0) {
          psVar38[5].distance_from_desired = -1;
        }
        auVar46 = (auVar63 | auVar29) ^ auVar45;
        auVar58._0_4_ = -(uint)(iVar65 < auVar46._0_4_);
        auVar58._4_4_ = -(uint)(iVar68 < auVar46._4_4_);
        auVar58._8_4_ = -(uint)(iVar69 < auVar46._8_4_);
        auVar58._12_4_ = -(uint)(iVar70 < auVar46._12_4_);
        auVar77._4_4_ = auVar58._0_4_;
        auVar77._0_4_ = auVar58._0_4_;
        auVar77._8_4_ = auVar58._8_4_;
        auVar77._12_4_ = auVar58._8_4_;
        iVar84 = -(uint)(auVar46._4_4_ == iVar68);
        iVar88 = -(uint)(auVar46._12_4_ == iVar70);
        auVar18._4_4_ = iVar84;
        auVar18._0_4_ = iVar84;
        auVar18._8_4_ = iVar88;
        auVar18._12_4_ = iVar88;
        auVar86._4_4_ = auVar58._4_4_;
        auVar86._0_4_ = auVar58._4_4_;
        auVar86._8_4_ = auVar58._12_4_;
        auVar86._12_4_ = auVar58._12_4_;
        auVar46 = auVar18 & auVar77 | auVar86;
        auVar46 = packssdw(auVar46,auVar46);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar46 = packssdw(auVar46 ^ auVar6,auVar46 ^ auVar6);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar38[6].distance_from_desired = -1;
        }
        auVar46 = pshufhw(auVar46,auVar77,0x84);
        auVar19._4_4_ = iVar84;
        auVar19._0_4_ = iVar84;
        auVar19._8_4_ = iVar88;
        auVar19._12_4_ = iVar88;
        auVar71 = pshufhw(auVar58,auVar19,0x84);
        auVar66 = pshufhw(auVar46,auVar86,0x84);
        auVar50._8_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff;
        auVar50._12_4_ = 0xffffffff;
        auVar50 = (auVar66 | auVar71 & auVar46) ^ auVar50;
        auVar46 = packssdw(auVar50,auVar50);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46._6_2_ >> 8 & 1) != 0) {
          psVar38[7].distance_from_desired = -1;
        }
        auVar46 = (auVar63 | auVar28) ^ auVar45;
        auVar59._0_4_ = -(uint)(iVar65 < auVar46._0_4_);
        auVar59._4_4_ = -(uint)(iVar68 < auVar46._4_4_);
        auVar59._8_4_ = -(uint)(iVar69 < auVar46._8_4_);
        auVar59._12_4_ = -(uint)(iVar70 < auVar46._12_4_);
        auVar20._4_4_ = auVar59._0_4_;
        auVar20._0_4_ = auVar59._0_4_;
        auVar20._8_4_ = auVar59._8_4_;
        auVar20._12_4_ = auVar59._8_4_;
        auVar71 = pshuflw(auVar86,auVar20,0xe8);
        auVar51._0_4_ = -(uint)(auVar46._0_4_ == iVar65);
        auVar51._4_4_ = -(uint)(auVar46._4_4_ == iVar68);
        auVar51._8_4_ = -(uint)(auVar46._8_4_ == iVar69);
        auVar51._12_4_ = -(uint)(auVar46._12_4_ == iVar70);
        auVar78._4_4_ = auVar51._4_4_;
        auVar78._0_4_ = auVar51._4_4_;
        auVar78._8_4_ = auVar51._12_4_;
        auVar78._12_4_ = auVar51._12_4_;
        auVar46 = pshuflw(auVar51,auVar78,0xe8);
        auVar79._4_4_ = auVar59._4_4_;
        auVar79._0_4_ = auVar59._4_4_;
        auVar79._8_4_ = auVar59._12_4_;
        auVar79._12_4_ = auVar59._12_4_;
        auVar66 = pshuflw(auVar59,auVar79,0xe8);
        auVar60._8_4_ = 0xffffffff;
        auVar60._0_8_ = 0xffffffffffffffff;
        auVar60._12_4_ = 0xffffffff;
        auVar60 = (auVar66 | auVar46 & auVar71) ^ auVar60;
        auVar66 = packssdw(auVar60,auVar60);
        auVar46 = packsswb(auVar46 & auVar71,auVar66);
        if ((auVar46 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar38[8].distance_from_desired = -1;
        }
        auVar21._4_4_ = auVar59._0_4_;
        auVar21._0_4_ = auVar59._0_4_;
        auVar21._8_4_ = auVar59._8_4_;
        auVar21._12_4_ = auVar59._8_4_;
        auVar79 = auVar78 & auVar21 | auVar79;
        auVar66 = packssdw(auVar79,auVar79);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar66 = packssdw(auVar66 ^ auVar7,auVar66 ^ auVar7);
        auVar46 = packsswb(auVar46,auVar66);
        if ((auVar46._8_2_ >> 8 & 1) != 0) {
          psVar38[9].distance_from_desired = -1;
        }
        auVar46 = (auVar63 | auVar27) ^ auVar45;
        auVar61._0_4_ = -(uint)(iVar65 < auVar46._0_4_);
        auVar61._4_4_ = -(uint)(iVar68 < auVar46._4_4_);
        auVar61._8_4_ = -(uint)(iVar69 < auVar46._8_4_);
        auVar61._12_4_ = -(uint)(iVar70 < auVar46._12_4_);
        auVar80._4_4_ = auVar61._0_4_;
        auVar80._0_4_ = auVar61._0_4_;
        auVar80._8_4_ = auVar61._8_4_;
        auVar80._12_4_ = auVar61._8_4_;
        iVar84 = -(uint)(auVar46._4_4_ == iVar68);
        iVar88 = -(uint)(auVar46._12_4_ == iVar70);
        auVar22._4_4_ = iVar84;
        auVar22._0_4_ = iVar84;
        auVar22._8_4_ = iVar88;
        auVar22._12_4_ = iVar88;
        auVar87._4_4_ = auVar61._4_4_;
        auVar87._0_4_ = auVar61._4_4_;
        auVar87._8_4_ = auVar61._12_4_;
        auVar87._12_4_ = auVar61._12_4_;
        auVar46 = auVar22 & auVar80 | auVar87;
        auVar46 = packssdw(auVar46,auVar46);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar46 = packssdw(auVar46 ^ auVar8,auVar46 ^ auVar8);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          psVar38[10].distance_from_desired = -1;
        }
        auVar46 = pshufhw(auVar46,auVar80,0x84);
        auVar23._4_4_ = iVar84;
        auVar23._0_4_ = iVar84;
        auVar23._8_4_ = iVar88;
        auVar23._12_4_ = iVar88;
        auVar71 = pshufhw(auVar61,auVar23,0x84);
        auVar66 = pshufhw(auVar46,auVar87,0x84);
        auVar52._8_4_ = 0xffffffff;
        auVar52._0_8_ = 0xffffffffffffffff;
        auVar52._12_4_ = 0xffffffff;
        auVar52 = (auVar66 | auVar71 & auVar46) ^ auVar52;
        auVar46 = packssdw(auVar52,auVar52);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46._10_2_ >> 8 & 1) != 0) {
          psVar38[0xb].distance_from_desired = -1;
        }
        auVar46 = (auVar63 | _DAT_003e73f0) ^ auVar45;
        auVar62._0_4_ = -(uint)(iVar65 < auVar46._0_4_);
        auVar62._4_4_ = -(uint)(iVar68 < auVar46._4_4_);
        auVar62._8_4_ = -(uint)(iVar69 < auVar46._8_4_);
        auVar62._12_4_ = -(uint)(iVar70 < auVar46._12_4_);
        auVar24._4_4_ = auVar62._0_4_;
        auVar24._0_4_ = auVar62._0_4_;
        auVar24._8_4_ = auVar62._8_4_;
        auVar24._12_4_ = auVar62._8_4_;
        auVar71 = pshuflw(auVar87,auVar24,0xe8);
        auVar53._0_4_ = -(uint)(auVar46._0_4_ == iVar65);
        auVar53._4_4_ = -(uint)(auVar46._4_4_ == iVar68);
        auVar53._8_4_ = -(uint)(auVar46._8_4_ == iVar69);
        auVar53._12_4_ = -(uint)(auVar46._12_4_ == iVar70);
        auVar81._4_4_ = auVar53._4_4_;
        auVar81._0_4_ = auVar53._4_4_;
        auVar81._8_4_ = auVar53._12_4_;
        auVar81._12_4_ = auVar53._12_4_;
        auVar46 = pshuflw(auVar53,auVar81,0xe8);
        auVar82._4_4_ = auVar62._4_4_;
        auVar82._0_4_ = auVar62._4_4_;
        auVar82._8_4_ = auVar62._12_4_;
        auVar82._12_4_ = auVar62._12_4_;
        auVar66 = pshuflw(auVar62,auVar82,0xe8);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar46 = packssdw(auVar46 & auVar71,(auVar66 | auVar46 & auVar71) ^ auVar9);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar38[0xc].distance_from_desired = -1;
        }
        auVar25._4_4_ = auVar62._0_4_;
        auVar25._0_4_ = auVar62._0_4_;
        auVar25._8_4_ = auVar62._8_4_;
        auVar25._12_4_ = auVar62._8_4_;
        auVar82 = auVar81 & auVar25 | auVar82;
        auVar66 = packssdw(auVar82,auVar82);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar46 = packssdw(auVar46,auVar66 ^ auVar10);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46._12_2_ >> 8 & 1) != 0) {
          psVar38[0xd].distance_from_desired = -1;
        }
        auVar46 = (auVar63 | _DAT_003e73e0) ^ auVar45;
        auVar54._0_4_ = -(uint)(iVar65 < auVar46._0_4_);
        auVar54._4_4_ = -(uint)(iVar68 < auVar46._4_4_);
        auVar54._8_4_ = -(uint)(iVar69 < auVar46._8_4_);
        auVar54._12_4_ = -(uint)(iVar70 < auVar46._12_4_);
        auVar83._4_4_ = auVar54._0_4_;
        auVar83._0_4_ = auVar54._0_4_;
        auVar83._8_4_ = auVar54._8_4_;
        auVar83._12_4_ = auVar54._8_4_;
        auVar64._4_4_ = -(uint)(auVar46._4_4_ == iVar68);
        auVar64._12_4_ = -(uint)(auVar46._12_4_ == iVar70);
        auVar64._0_4_ = auVar64._4_4_;
        auVar64._8_4_ = auVar64._12_4_;
        auVar67._4_4_ = auVar54._4_4_;
        auVar67._0_4_ = auVar54._4_4_;
        auVar67._8_4_ = auVar54._12_4_;
        auVar67._12_4_ = auVar54._12_4_;
        auVar66 = auVar64 & auVar83 | auVar67;
        auVar46 = packssdw(auVar54,auVar66);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar46 = packssdw(auVar46 ^ auVar11,auVar46 ^ auVar11);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar38[0xe].distance_from_desired = -1;
        }
        auVar46 = pshufhw(auVar46,auVar83,0x84);
        in_XMM2 = pshufhw(auVar66,auVar64,0x84);
        in_XMM2 = in_XMM2 & auVar46;
        auVar46 = pshufhw(auVar46,auVar67,0x84);
        auVar55._8_4_ = 0xffffffff;
        auVar55._0_8_ = 0xffffffffffffffff;
        auVar55._12_4_ = 0xffffffff;
        auVar55 = (auVar46 | in_XMM2) ^ auVar55;
        auVar46 = packssdw(auVar55,auVar55);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46._14_2_ >> 8 & 1) != 0) {
          psVar38[0xf].distance_from_desired = -1;
        }
        uVar37 = uVar37 + 0x10;
        psVar38 = psVar38 + 0x10;
      } while ((uVar1 / 0x28 + 0x10 & 0xfffffffffffffff0) != uVar37);
    }
    psVar36[local_38 + (uVar35 - 1)].distance_from_desired = '\0';
    begin = this->entries;
    sVar34 = this->num_slots_minus_one;
    this->entries = psVar36;
    this->num_slots_minus_one = local_38 - 1;
    (this->hash_policy).shift = iVar33;
    max_lookups = this->max_lookups;
    this->max_lookups = bVar39;
    this->num_elements = 0;
    local_38 = sVar34;
    if (begin != begin + sVar34 + (long)max_lookups) {
      lVar40 = (long)max_lookups * 0x28 + sVar34 * 0x28;
      psVar26 = begin;
      do {
        key = &psVar26->field_1;
        if (-1 < *(char *)((long)(key + -1) + 0x18)) {
          sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>>>
          ::
          emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>
                    ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>>>
                      *)this,&key->value);
          *(undefined1 *)((long)(key + -1) + 0x18) = 0xff;
        }
        psVar26 = (EntryPointer)(key + 1);
        lVar40 = lVar40 + -0x28;
      } while (lVar40 != 0);
    }
    deallocate_data(this,begin,local_38,max_lookups);
  }
  return;
}

Assistant:

void rehash(size_t num_buckets)
    {
        num_buckets = std::max(num_buckets, static_cast<size_t>(std::ceil(num_elements / static_cast<double>(_max_load_factor))));
        if (num_buckets == 0)
        {
            reset_to_empty_state();
            return;
        }
        auto new_prime_index = hash_policy.next_size_over(num_buckets);
        if (num_buckets == bucket_count())
            return;
        int8_t new_max_lookups = compute_max_lookups(num_buckets);
        EntryPointer new_buckets(AllocatorTraits::allocate(*this, num_buckets + new_max_lookups));
        EntryPointer special_end_item = new_buckets + static_cast<ptrdiff_t>(num_buckets + new_max_lookups - 1);
        for (EntryPointer it = new_buckets; it != special_end_item; ++it)
            it->distance_from_desired = -1;
        special_end_item->distance_from_desired = Entry::special_end_value;
        std::swap(entries, new_buckets);
        std::swap(num_slots_minus_one, num_buckets);
        --num_slots_minus_one;
        hash_policy.commit(new_prime_index);
        int8_t old_max_lookups = max_lookups;
        max_lookups = new_max_lookups;
        num_elements = 0;
        for (EntryPointer it = new_buckets, end = it + static_cast<ptrdiff_t>(num_buckets + old_max_lookups); it != end; ++it)
        {
            if (it->has_value())
            {
                emplace(std::move(it->value));
                it->destroy_value();
            }
        }
        deallocate_data(new_buckets, num_buckets, old_max_lookups);
    }